

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# insert_ordered.h
# Opt level: O0

InsertOrderedSet<wasm::Name> * __thiscall
wasm::InsertOrderedSet<wasm::Name>::operator=
          (InsertOrderedSet<wasm::Name> *this,InsertOrderedSet<wasm::Name> *other)

{
  bool bVar1;
  reference pNVar2;
  undefined1 local_40 [8];
  Name i;
  const_iterator __end0;
  const_iterator __begin0;
  list<wasm::Name,_std::allocator<wasm::Name>_> *__range2;
  InsertOrderedSet<wasm::Name> *other_local;
  InsertOrderedSet<wasm::Name> *this_local;
  
  clear(this);
  __end0 = std::__cxx11::list<wasm::Name,_std::allocator<wasm::Name>_>::begin(&other->List);
  i.super_IString.str._M_str =
       (char *)std::__cxx11::list<wasm::Name,_std::allocator<wasm::Name>_>::end(&other->List);
  while( true ) {
    bVar1 = std::operator!=(&__end0,(_Self *)&i.super_IString.str._M_str);
    if (!bVar1) break;
    pNVar2 = std::_List_const_iterator<wasm::Name>::operator*(&__end0);
    local_40 = (undefined1  [8])(pNVar2->super_IString).str._M_len;
    i.super_IString.str._M_len = (size_t)(pNVar2->super_IString).str._M_str;
    insert(this,(Name *)local_40);
    std::_List_const_iterator<wasm::Name>::operator++(&__end0);
  }
  return this;
}

Assistant:

InsertOrderedSet& operator=(const InsertOrderedSet& other) {
    clear();
    for (auto i : other.List) {
      insert(i); // inserting manually creates proper iterators
    }
    return *this;
  }